

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O2

void TIFFSwabArrayOfShort(uint16_t *wp,tmsize_t n)

{
  ushort *puVar1;
  long lVar2;
  
  lVar2 = (long)wp + 1;
  for (; 0 < n; n = n + -1) {
    puVar1 = (ushort *)(lVar2 + -1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    lVar2 = lVar2 + 2;
  }
  return;
}

Assistant:

void TIFFSwabArrayOfShort(register uint16_t *wp, tmsize_t n)
{
    register unsigned char *cp;
    register unsigned char t;
    assert(sizeof(uint16_t) == 2);
    /* XXX unroll loop some */
    while (n-- > 0)
    {
        cp = (unsigned char *)wp;
        t = cp[1];
        cp[1] = cp[0];
        cp[0] = t;
        wp++;
    }
}